

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O2

void exr_get_library_version(int *maj,int *min,int *patch,char **extra)

{
  if (maj != (int *)0x0) {
    *maj = 3;
  }
  if (min != (int *)0x0) {
    *min = 4;
  }
  if (patch != (int *)0x0) {
    *patch = 0;
  }
  if (extra != (char **)0x0) {
    *extra = "-dev";
  }
  return;
}

Assistant:

void
exr_get_library_version (int* maj, int* min, int* patch, const char** extra)
{
    if (maj) *maj = OPENEXR_VERSION_MAJOR;
    if (min) *min = OPENEXR_VERSION_MINOR;
    if (patch) *patch = OPENEXR_VERSION_PATCH;
#ifdef OPENEXR_VERSION_EXTRA
    if (extra) *extra = OPENEXR_VERSION_EXTRA;
#else
    if (extra) *extra = "";
#endif
}